

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall embree::ISPCScene::commit(ISPCScene *this)

{
  uint geomID;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < this->numGeometries; uVar1 = uVar1 + 1) {
    rtcAttachGeometryByID(this->scene,this->geometries[uVar1]->geometry,uVar1 & 0xffffffff);
  }
  rtcCommitScene(this->scene);
  return;
}

Assistant:

void ISPCScene::commit()
  {
    for (unsigned int geomID=0; geomID<numGeometries; geomID++)
    {
      ISPCGeometry* geometry = geometries[geomID];
      rtcAttachGeometryByID(scene,geometry->geometry,geomID);
    }

    rtcCommitScene(scene);
  }